

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

Aig_Man_t *
createDisjunctiveMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors,int *startMonotonePropPo)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *p;
  size_t sVar6;
  char *__s;
  Aig_Obj_t *pAVar7;
  uint *__ptr;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  uint *__ptr_00;
  uint *__ptr_01;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  Aig_Obj_t *pAVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int local_84;
  ulong local_70;
  Aig_Obj_t *local_60;
  
  pVVar1 = anteConseVectors->attrConsequentCandidates;
  if (pVVar1 == (Vec_Int_t *)0x0) {
    p = (Aig_Man_t *)0x0;
  }
  else {
    uVar4 = aigPoIndicesArg->attrPendingSignalIndex;
    pVVar2 = anteConseVectors->attrAntecedents;
    p = Aig_ManStart(pAig->vObjs->nSize);
    sVar6 = strlen(pAig->pName);
    __s = (char *)malloc(sVar6 + 0xb);
    p->pName = __s;
    iVar17 = 0;
    sprintf(__s,"%s_%s",pAig->pName,"monotone");
    p->pSpec = (char *)0x0;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    if (0 < pAig->nTruePis) {
      lVar15 = 0;
      do {
        if (pAig->vCis->nSize <= lVar15) goto LAB_005953f6;
        pvVar8 = pAig->vCis->pArray[lVar15];
        pAVar7 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar7;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pAig->nTruePis);
    }
    if (0 < pAig->nRegs) {
      iVar17 = 0;
      do {
        uVar3 = pAig->nTruePis + iVar17;
        if (((int)uVar3 < 0) || (pAig->vCis->nSize <= (int)uVar3)) goto LAB_005953f6;
        pvVar8 = pAig->vCis->pArray[uVar3];
        iVar17 = iVar17 + 1;
        pAVar7 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar7;
      } while (iVar17 < pAig->nRegs);
    }
    pAVar7 = Aig_ObjCreateCi(p);
    uVar3 = pVVar1->nSize;
    __ptr = (uint *)malloc(0x10);
    uVar20 = 8;
    if (6 < uVar3 - 1) {
      uVar20 = (ulong)uVar3;
    }
    __ptr[1] = 0;
    uVar18 = (uint)uVar20;
    *__ptr = uVar18;
    if (uVar18 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar18 << 3);
    }
    *(void **)(__ptr + 2) = pvVar8;
    if ((int)uVar3 < 1) {
      local_84 = 1;
      uVar13 = 0;
    }
    else {
      uVar16 = 0;
      do {
        pAVar9 = Aig_ObjCreateCi(p);
        iVar19 = (int)uVar20;
        if ((int)uVar16 == iVar19) {
          if (iVar19 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar8;
            *__ptr = 0x10;
            uVar20 = 0x10;
          }
          else {
            uVar20 = (ulong)(uint)(iVar19 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc(uVar20 * 8);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),uVar20 * 8);
            }
            *(void **)(__ptr + 2) = pvVar8;
            *__ptr = iVar19 * 2;
          }
        }
        else {
          pvVar8 = *(void **)(__ptr + 2);
        }
        uVar13 = uVar16 + 1;
        uVar3 = (uint)uVar13;
        __ptr[1] = uVar3;
        *(Aig_Obj_t **)((long)pvVar8 + uVar16 * 8) = pAVar9;
        uVar16 = uVar13;
      } while ((int)uVar3 < pVVar1->nSize);
      local_84 = uVar3 + 1;
    }
    pVVar10 = pAig->vObjs;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        pvVar8 = pVVar10->pArray[lVar15];
        if ((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar8 & 1) != 0) goto LAB_00595415;
          uVar20 = *(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe;
          if (uVar20 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^ *(ulong *)(uVar20 + 0x28));
          }
          uVar20 = *(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe;
          if (uVar20 == 0) {
            pAVar14 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar14 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar8 + 0x10) & 1) ^
                      *(ulong *)(uVar20 + 0x28));
          }
          pAVar9 = Aig_And(p,pAVar9,pAVar14);
          *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar9;
          pVVar10 = pAig->vObjs;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar10->nSize);
    }
    uVar3 = aigPoIndicesArg->attrSafetyInvarIndex;
    if ((ulong)uVar3 == 0xffffffff) {
      local_60 = p->pConst1;
      pVVar10 = pAig->vCos;
    }
    else {
      if (((int)uVar3 < 0) || (pVVar10 = pAig->vCos, pVVar10->nSize <= (int)uVar3))
      goto LAB_005953f6;
      uVar20 = *(ulong *)((long)pVVar10->pArray[uVar3] + 8);
      if ((uVar20 & 1) == 0) {
        local_60 = *(Aig_Obj_t **)(uVar20 + 0x28);
      }
      else {
        local_60 = (Aig_Obj_t *)(*(ulong *)((uVar20 & 0xfffffffffffffffe) + 0x28) ^ 1);
      }
    }
    if (((int)uVar4 < 0) || (pVVar10->nSize <= (int)uVar4)) {
LAB_005953f6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar20 = *(ulong *)((long)pVVar10->pArray[uVar4] + 8);
    if ((uVar20 & 1) == 0) {
      pAVar9 = *(Aig_Obj_t **)(uVar20 + 0x28);
    }
    else {
      pAVar9 = (Aig_Obj_t *)(*(ulong *)((uVar20 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    pAVar7 = Aig_And(p,pAVar9,pAVar7);
    pAVar14 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    if ((pVVar2 != (Vec_Int_t *)0x0) && (0 < pVVar2->nSize)) {
      lVar15 = 0;
      do {
        iVar19 = pVVar2->pArray[lVar15];
        if (((long)iVar19 < 0) || (pAig->vCos->nSize <= iVar19)) goto LAB_005953f6;
        uVar20 = *(ulong *)((long)pAig->vCos->pArray[iVar19] + 8);
        if ((uVar20 & 1) == 0) {
          pAVar11 = *(Aig_Obj_t **)(uVar20 + 0x28);
        }
        else {
          pAVar11 = (Aig_Obj_t *)(*(ulong *)((uVar20 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        pAVar14 = Aig_Or(p,pAVar11,pAVar14);
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar2->nSize);
    }
    uVar4 = pVVar1->nSize;
    __ptr_00 = (uint *)malloc(0x10);
    uVar20 = 8;
    if (6 < uVar4 - 1) {
      uVar20 = (ulong)uVar4;
    }
    __ptr_00[1] = 0;
    uVar3 = (uint)uVar20;
    *__ptr_00 = uVar3;
    if (uVar3 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar3 * 8);
    }
    *(void **)(__ptr_00 + 2) = pvVar8;
    __ptr_01 = (uint *)malloc(0x10);
    uVar16 = 0;
    __ptr_01[1] = 0;
    if (uVar3 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar3 << 3);
    }
    *(void **)(__ptr_01 + 2) = pvVar8;
    if (0 < (int)uVar4) {
      uVar21 = 0;
      local_70 = uVar20;
      do {
        iVar19 = pVVar1->pArray[uVar21];
        if (((long)iVar19 < 0) || (pAig->vCos->nSize <= iVar19)) goto LAB_005953f6;
        uVar16 = *(ulong *)((long)pAig->vCos->pArray[iVar19] + 8);
        if ((uVar16 & 1) == 0) {
          pAVar11 = *(Aig_Obj_t **)(uVar16 + 0x28);
        }
        else {
          pAVar11 = (Aig_Obj_t *)(*(ulong *)((uVar16 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        pAVar11 = Aig_Or(p,pAVar11,pAVar14);
        if (uVar13 <= uVar21) goto LAB_005953f6;
        pAVar12 = Aig_And(p,pAVar7,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar21 * 8));
        pAVar12 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar12 ^ 1),pAVar11);
        pAVar12 = Aig_And(p,pAVar12,local_60);
        iVar19 = (int)uVar21;
        iVar22 = (int)uVar20;
        if (iVar19 == iVar22) {
          if (iVar22 < 0x10) {
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_01 + 2),0x80);
            }
            *(void **)(__ptr_01 + 2) = pvVar8;
            *__ptr_01 = 0x10;
            uVar20 = 0x10;
          }
          else {
            uVar20 = (ulong)(uint)(iVar22 * 2);
            if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
              pvVar8 = malloc(uVar20 * 8);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_01 + 2),uVar20 * 8);
            }
            *(void **)(__ptr_01 + 2) = pvVar8;
            *__ptr_01 = iVar22 * 2;
          }
        }
        else {
          pvVar8 = *(void **)(__ptr_01 + 2);
        }
        __ptr_01[1] = iVar19 + 1;
        *(Aig_Obj_t **)((long)pvVar8 + uVar21 * 8) = pAVar11;
        iVar22 = (int)local_70;
        if (iVar19 == iVar22) {
          if (iVar22 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar8;
            *__ptr_00 = 0x10;
            local_70 = 0x10;
          }
          else {
            local_70 = (ulong)(uint)(iVar22 * 2);
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(local_70 * 8);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),local_70 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar8;
            *__ptr_00 = iVar22 * 2;
          }
        }
        else {
          pvVar8 = *(void **)(__ptr_00 + 2);
        }
        uVar16 = uVar21 + 1;
        __ptr_00[1] = (uint)uVar16;
        *(Aig_Obj_t **)((long)pvVar8 + uVar21 * 8) = pAVar12;
        uVar21 = uVar16;
      } while ((long)uVar16 < (long)pVVar1->nSize);
    }
    if (pAig->nTruePos < 1) {
      lVar15 = 0;
    }
    else {
      lVar15 = 0;
      do {
        if (pAig->vCos->nSize <= lVar15) goto LAB_005953f6;
        pvVar8 = pAig->vCos->pArray[lVar15];
        if (((ulong)pvVar8 & 1) != 0) goto LAB_00595415;
        uVar20 = *(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe;
        if (uVar20 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar8 + 8) & 1) ^ *(ulong *)(uVar20 + 0x28));
        }
        pAVar7 = Aig_ObjCreateCo(p,pAVar7);
        *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar7;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pAig->nTruePos);
    }
    *startMonotonePropPo = (int)lVar15;
    iVar19 = (int)uVar16;
    if (0 < iVar19) {
      lVar15 = *(long *)(__ptr_00 + 2);
      uVar20 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar15 + uVar20 * 8));
        uVar20 = uVar20 + 1;
      } while ((uVar16 & 0xffffffff) != uVar20);
    }
    if (pAig->nRegs < 1) {
      iVar22 = 0;
    }
    else {
      iVar22 = 0;
      do {
        uVar4 = pAig->nTruePos + iVar22;
        if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_005953f6;
        pvVar8 = pAig->vCos->pArray[uVar4];
        if (((ulong)pvVar8 & 1) != 0) {
LAB_00595415:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar20 = *(ulong *)((long)pvVar8 + 8);
        uVar13 = uVar20 & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar20 & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        iVar22 = iVar22 + 1;
        Aig_ObjCreateCo(p,pAVar7);
      } while (iVar22 < pAig->nRegs);
    }
    Aig_ObjCreateCo(p,pAVar9);
    if (iVar19 < 1) {
      iVar19 = 1;
    }
    else {
      lVar15 = *(long *)(__ptr_01 + 2);
      uVar20 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar15 + uVar20 * 8));
        uVar20 = uVar20 + 1;
      } while ((uVar16 & 0xffffffff) != uVar20);
      iVar19 = iVar19 + 1;
    }
    Aig_ManSetRegNum(p,local_84 + iVar17);
    Aig_ManCleanup(p);
    iVar5 = Aig_ManCheck(p);
    if (iVar5 == 0) {
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/disjunctiveMonotone.c"
                    ,0x10a,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    if (local_84 + iVar17 != iVar19 + iVar22) {
      __assert_fail("loCopied + loCreated == liCopied + liCreated",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/disjunctiveMonotone.c"
                    ,0x10b,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
    }
    free(__ptr);
    if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 2));
    }
    free(__ptr_00);
    if (*(void **)(__ptr_01 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_01 + 2));
    }
    free(__ptr_01);
  }
  return p;
}

Assistant:

Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, 
					struct antecedentConsequentVectorsStruct *anteConseVectors, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pObjConseCandFlop, *pObjSafetyInvariantPoDriver;
	//Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vConseCandFlopOutput;
	//Vec_Ptr_t *vHintMonotoneLocalProp;

	Aig_Obj_t *pObjAnteDisjunction, *pObjConsecDriver, *pObjConsecDriverNew, *pObjCandMonotone, *pObjPrevCandMonotone, *pObjMonotonePropDriver;
	Vec_Ptr_t *vCandMonotoneProp;
	Vec_Ptr_t *vCandMonotoneFlopInput;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

	Vec_Int_t *vAntecedentsLocal = anteConseVectors->attrAntecedents;
	Vec_Int_t *vConsequentCandidatesLocal = anteConseVectors->attrConsequentCandidates;

	if( vConsequentCandidatesLocal == NULL )
		return NULL; //no candidates for consequent is provided, hence no need to generate a new AIG

	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 2 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vConseCandFlopOutput = Vec_PtrAlloc(Vec_IntSize(vConsequentCandidatesLocal));
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		loCreated++;
		pObjConseCandFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vConseCandFlopOutput, pObjConseCandFlop );
	}

	nRegCount = loCreated + loCopied;

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	if( aigPoIndicesArg->attrSafetyInvarIndex != -1 )
	{
		pObjPo = Aig_ManCo( pAig, aigPoIndicesArg->attrSafetyInvarIndex );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
		pObjSafetyInvariantPoDriver = pObjDriverNew;
	}
	else
		pObjSafetyInvariantPoDriver = Aig_ManConst1(pNewAig);

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	pObjAnteDisjunction = Aig_Not(Aig_ManConst1( pNewAig ));
	if( vAntecedentsLocal )
	{
		Vec_IntForEachEntry( vAntecedentsLocal, iElem, i )
		{
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

			pObjAnteDisjunction = Aig_Or( pNewAig, pObjDriverNew, pObjAnteDisjunction );
		}
	}

	vCandMonotoneProp = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	vCandMonotoneFlopInput = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjConsecDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjConsecDriverNew = !Aig_IsComplement(pObjConsecDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData));

		pObjCandMonotone = Aig_Or( pNewAig, pObjConsecDriverNew, pObjAnteDisjunction );
		pObjPrevCandMonotone = (Aig_Obj_t *)(Vec_PtrEntry( vConseCandFlopOutput, i ));
		pObjMonotonePropDriver = Aig_Or( pNewAig, Aig_Not( Aig_And( pNewAig, pObjPendingAndNextPending, pObjPrevCandMonotone ) ), 
						pObjCandMonotone );

		//Conjunting safety invar
		pObjMonotonePropDriver = Aig_And( pNewAig, pObjMonotonePropDriver, pObjSafetyInvariantPoDriver );
						
		Vec_PtrPush( vCandMonotoneFlopInput, pObjCandMonotone );
		Vec_PtrPush( vCandMonotoneProp, pObjMonotonePropDriver );
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneFlopInput, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	Vec_PtrFree(vConseCandFlopOutput);
	Vec_PtrFree(vCandMonotoneProp);
	Vec_PtrFree(vCandMonotoneFlopInput);
	return pNewAig;
}